

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O2

string * __thiscall
google::protobuf::text_format_unittest::CustomMessageFieldValuePrinter::PrintInt32_abi_cxx11_
          (string *__return_storage_ptr__,CustomMessageFieldValuePrinter *this,int32_t v)

{
  AlphaNum *in_R8;
  StringifySink local_f8;
  string local_d8;
  Hex local_b8;
  AlphaNum local_a8;
  size_type local_78;
  pointer local_70;
  AlphaNum local_48;
  
  TextFormat::FieldValuePrinter::PrintInt32_abi_cxx11_(&local_d8,&this->super_FieldValuePrinter,v);
  local_78 = local_d8._M_string_length;
  local_70 = local_d8._M_dataplus._M_p;
  local_a8.piece_ = absl::lts_20250127::NullSafeStringView("  # x");
  local_b8.value = (uint64_t)(uint)v;
  local_b8.width = '\x01';
  local_b8.fill = '0';
  local_f8.buffer_._M_dataplus._M_p = (pointer)&local_f8.buffer_.field_2;
  local_f8.buffer_.field_2._M_allocated_capacity = 0;
  local_f8.buffer_.field_2._8_8_ = 0;
  local_f8.buffer_._M_string_length = 0;
  local_48.piece_ =
       absl::lts_20250127::strings_internal::ExtractStringification<absl::lts_20250127::Hex>
                 (&local_f8,&local_b8);
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_78,&local_a8,&local_48,in_R8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  return __return_storage_ptr__;
}

Assistant:

std::string PrintInt32(int32_t v) const override {
    return absl::StrCat(FieldValuePrinter::PrintInt32(v), "  # x",
                        absl::Hex(v));
  }